

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O1

void __thiscall
helics::CommsBroker<helics::ipc::IpcComms,_helics::CommonCore>::CommsBroker
          (CommsBroker<helics::ipc::IpcComms,_helics::CommonCore> *this)

{
  CommonCore::CommonCore(&this->super_CommonCore);
  (this->super_CommonCore).super_Core._vptr_Core = (_func_int **)&PTR__CommsBroker_0056d090;
  (this->super_CommonCore).super_BrokerBase._vptr_BrokerBase =
       (_func_int **)&PTR__CommsBroker_0056d428;
  *(undefined8 *)&(this->super_CommonCore).field_0xd84 = 0;
  *(undefined8 *)
   ((long)&(this->comms)._M_t.
           super___uniq_ptr_impl<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::ipc::IpcComms_*,_std::default_delete<helics::ipc::IpcComms>_>
           .super__Head_base<0UL,_helics::ipc::IpcComms_*,_false>._M_head_impl + 1) = 0;
  loadComms(this);
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::CommsBroker() noexcept
{
    static_assert(std::is_base_of<CommsInterface, COMMS>::value,
                  "COMMS object must be a CommsInterface Object");
    static_assert(std::is_base_of<BrokerBase, BrokerT>::value,
                  "Broker must be an object  with a base of BrokerBase");
    loadComms();
}